

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O1

void once_init(void)

{
  AsyncLogging *pAVar1;
  string *logFileName_;
  string local_40;
  
  pAVar1 = (AsyncLogging *)operator_new(0x1f8);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,Logger::logFileName__abi_cxx11_._M_dataplus._M_p,
             Logger::logFileName__abi_cxx11_._M_dataplus._M_p +
             Logger::logFileName__abi_cxx11_._M_string_length);
  logFileName_ = &local_40;
  AsyncLogging::AsyncLogging(pAVar1,logFileName_,2);
  AsyncLogger_ = pAVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pAVar1 = AsyncLogger_;
  AsyncLogger_->running_ = true;
  Thread::start(&pAVar1->thread_);
  CountDownLatch::wait(&pAVar1->latch_,logFileName_);
  return;
}

Assistant:

void once_init()
{
    AsyncLogger_ = new AsyncLogging(Logger::getLogFileName());
    AsyncLogger_->start(); 
}